

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFAContentModel.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DFAContentModel::checkUniqueParticleAttribution
          (DFAContentModel *this,SchemaGrammar *pGrammar,GrammarResolver *pGrammarResolver,
          XMLStringPool *pStringPool,XMLValidator *pValidator,uint *pContentSpecOrgURI,
          XMLCh *pComplexTypeName)

{
  uint uVar1;
  uint uVar2;
  QName **ppQVar3;
  Occurence *pOVar4;
  bool bVar5;
  int iVar6;
  NodeTypes NVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar8;
  undefined4 extraout_var_02;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  XMLBuffer buf2;
  XMLBuffer buf1;
  ConflictTableKeeper keeper;
  SubstitutionGroupComparator comparator;
  XMLBuffer local_d8;
  XMLBuffer local_a0;
  XMLValidator *local_68;
  SchemaGrammar *local_60;
  ConflictTableKeeper local_58;
  SubstitutionGroupComparator local_40;
  char **__s;
  
  uVar1 = this->fElemMapSize;
  if ((ulong)uVar1 != 0) {
    ppQVar3 = this->fElemMap;
    uVar12 = 0;
    do {
      uVar2 = ppQVar3[uVar12]->fURIId;
      if ((((uVar2 != 0xfffffff1) && (uVar2 != 0xfffffff2)) && (uVar2 != 0xfffffffe)) &&
         (uVar2 != 0xffffffff)) {
        ppQVar3[uVar12]->fURIId = pContentSpecOrgURI[uVar2];
      }
      uVar12 = uVar12 + 1;
    } while (uVar1 != uVar12);
  }
  local_68 = pValidator;
  local_60 = pGrammar;
  local_40.fGrammarResolver = pGrammarResolver;
  local_40.fStringPool = pStringPool;
  iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
  __s = (char **)CONCAT44(extraout_var,iVar6);
  memset(__s,0,(ulong)this->fElemMapSize << 3);
  local_58.fMemoryManager = this->fMemoryManager;
  local_58.fElemMapSize = this->fElemMapSize;
  local_58.fConflictTable = __s;
  if (local_58.fElemMapSize != 0) {
    uVar12 = 0;
    do {
      iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
      __s[uVar12] = (char *)CONCAT44(extraout_var_00,iVar6);
      memset((char *)CONCAT44(extraout_var_00,iVar6),0,(ulong)this->fElemMapSize);
      uVar12 = uVar12 + 1;
    } while (uVar12 < this->fElemMapSize);
  }
  if (this->fTransTableSize != 0) {
    uVar12 = 0;
    do {
      if (this->fElemMapSize != 0) {
        uVar11 = 0;
        do {
          if ((this->fTransTable[uVar12][uVar11] != 0xffffffff) &&
             (uVar9 = uVar11, uVar11 + 1 < (ulong)this->fElemMapSize)) {
            do {
              if (((this->fTransTable[uVar12][uVar9 + 1] != 0xffffffff) &&
                  (__s[uVar11][uVar9 + 1] == '\0')) &&
                 ((this->fIsMixed != true ||
                  ((this->fElemMap[uVar11]->fURIId != 0xffffffff &&
                   (this->fElemMap[uVar9 + 1]->fURIId != 0xffffffff)))))) {
                bVar5 = XercesElementWildcard::conflict
                                  (local_60,this->fElemMapType[uVar11],this->fElemMap[uVar11],
                                   this->fElemMapType[uVar9 + 1],this->fElemMap[uVar9 + 1],&local_40
                                  );
                if ((bVar5) &&
                   ((((this->fCountingStates == (Occurence **)0x0 ||
                      (pOVar4 = this->fCountingStates[uVar12], pOVar4 == (Occurence *)0x0)) ||
                     ((uVar12 == this->fTransTable[uVar12][uVar11]) ==
                      (uVar12 == this->fTransTable[uVar12][uVar9 + 1]))) ||
                    (pOVar4->minOccurs != pOVar4->maxOccurs)))) {
                  __s[uVar11][uVar9 + 1] = '\x01';
                  local_a0.fMemoryManager = this->fMemoryManager;
                  local_a0.fIndex = 0;
                  local_a0.fCapacity = 0x3ff;
                  local_a0.fFullSize = 0;
                  local_a0.fUsed = false;
                  local_a0.fFullHandler = (XMLBufferFullHandler *)0x0;
                  local_a0.fBuffer = (XMLCh *)0x0;
                  iVar6 = (*(local_a0.fMemoryManager)->_vptr_MemoryManager[3])
                                    (local_a0.fMemoryManager,0x800);
                  local_a0.fBuffer = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
                  *local_a0.fBuffer = L'\0';
                  NVar7 = this->fElemMapType[uVar11] & (Any_NS|Any_Other);
                  if (NVar7 == Any_NS) {
LAB_002f2cba:
                    pXVar8 = L"##any";
LAB_002f2cf9:
                    local_a0.fIndex = 0;
                    if (*pXVar8 != L'\0') {
                      XMLBuffer::append(&local_a0,pXVar8);
                    }
                  }
                  else {
                    if (NVar7 == Any_Other) {
                      pXVar8 = L"##other";
                      goto LAB_002f2cf9;
                    }
                    if (NVar7 == Any) goto LAB_002f2cba;
                    pXVar8 = QName::getRawName(this->fElemMap[uVar11]);
                    local_a0.fIndex = 0;
                    if (pXVar8 != (XMLCh *)0x0) goto LAB_002f2cf9;
                  }
                  local_d8.fMemoryManager = this->fMemoryManager;
                  local_d8.fIndex = 0;
                  local_d8.fCapacity = 0x3ff;
                  local_d8.fFullSize = 0;
                  local_d8.fUsed = false;
                  local_d8.fFullHandler = (XMLBufferFullHandler *)0x0;
                  local_d8.fBuffer = (XMLCh *)0x0;
                  iVar6 = (*(local_d8.fMemoryManager)->_vptr_MemoryManager[3])
                                    (local_d8.fMemoryManager,0x800);
                  local_d8.fBuffer = (XMLCh *)CONCAT44(extraout_var_02,iVar6);
                  *local_d8.fBuffer = L'\0';
                  NVar7 = this->fElemMapType[uVar9 + 1] & (Any_NS|Any_Other);
                  if (NVar7 == Any_NS) {
LAB_002f2d6c:
                    pXVar8 = L"##any";
LAB_002f2dac:
                    local_d8.fIndex = 0;
                    if (*pXVar8 != L'\0') {
                      XMLBuffer::append(&local_d8,pXVar8);
                    }
                  }
                  else {
                    if (NVar7 == Any_Other) {
                      pXVar8 = L"##other";
                      goto LAB_002f2dac;
                    }
                    if (NVar7 == Any) goto LAB_002f2d6c;
                    pXVar8 = QName::getRawName(this->fElemMap[uVar9 + 1]);
                    local_d8.fIndex = 0;
                    if (pXVar8 != (XMLCh *)0x0) goto LAB_002f2dac;
                  }
                  local_a0.fBuffer[local_a0.fIndex] = L'\0';
                  local_d8.fBuffer[local_d8.fIndex] = L'\0';
                  XMLValidator::emitError
                            (local_68,UniqueParticleAttributionFail,pComplexTypeName,
                             local_a0.fBuffer,local_d8.fBuffer,(XMLCh *)0x0);
                  (*(local_d8.fMemoryManager)->_vptr_MemoryManager[4])
                            (local_d8.fMemoryManager,local_d8.fBuffer);
                  (*(local_a0.fMemoryManager)->_vptr_MemoryManager[4])
                            (local_a0.fMemoryManager,local_a0.fBuffer);
                }
                else {
                  __s[uVar11][uVar9 + 1] = -1;
                }
              }
              uVar10 = uVar9 + 2;
              uVar9 = uVar9 + 1;
            } while (uVar10 < this->fElemMapSize);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < this->fElemMapSize);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < this->fTransTableSize);
  }
  checkUniqueParticleAttribution::ConflictTableKeeper::~ConflictTableKeeper(&local_58);
  return;
}

Assistant:

void DFAContentModel::checkUniqueParticleAttribution (SchemaGrammar*    const pGrammar,
                                                      GrammarResolver*  const pGrammarResolver,
                                                      XMLStringPool*    const pStringPool,
                                                      XMLValidator*     const pValidator,
                                                      unsigned int*     const pContentSpecOrgURI,
                                                      const XMLCh*            pComplexTypeName /*= 0*/)
{

    SubstitutionGroupComparator comparator(pGrammarResolver, pStringPool);

    unsigned int i, j, k;

    // Rename the URI back
    for (i = 0; i < fElemMapSize; i++) {

        unsigned int orgURIIndex = fElemMap[i]->getURI();

        if ((orgURIIndex != XMLContentModel::gEOCFakeId) &&
            (orgURIIndex != XMLContentModel::gEpsilonFakeId) &&
            (orgURIIndex != XMLElementDecl::fgInvalidElemId) &&
            (orgURIIndex != XMLElementDecl::fgPCDataElemId)) {
            fElemMap[i]->setURI(pContentSpecOrgURI[orgURIIndex]);
        }
    }

    // Unique Particle Attribution
    // Store the conflict results between any two elements in fElemMap
    // 0 - not yet tested, 1 - conflict, (-1) - no conflict
    signed char** conflictTable = (signed char**) fMemoryManager->allocate
    (
        fElemMapSize * sizeof(signed char*)
    );
    memset(conflictTable, 0, fElemMapSize * sizeof(signed char*));

    struct ConflictTableKeeper
    {
        MemoryManager* fMemoryManager;
        signed char**  fConflictTable;
        unsigned int   fElemMapSize;

        ConflictTableKeeper(MemoryManager* memoryManager,
                            signed char** conflictTable,
                            unsigned int elemMapSize):
            fMemoryManager(memoryManager),
            fConflictTable(conflictTable),
            fElemMapSize(elemMapSize)
        {
        }

        ~ConflictTableKeeper()
        {
            for (int i = 0; i < fElemMapSize; i++)
                fMemoryManager->deallocate(fConflictTable[i]);
            fMemoryManager->deallocate(fConflictTable);
        }
    };

    ConflictTableKeeper keeper(fMemoryManager, conflictTable, fElemMapSize);

    // initialize the conflict table
    for (j = 0; j < fElemMapSize; j++) {
        conflictTable[j] = (signed char*) fMemoryManager->allocate
        (
            fElemMapSize * sizeof(signed char)
        );
        memset(conflictTable[j], 0, fElemMapSize*sizeof(signed char));
    }

    // for each state, check whether it has overlap transitions
    for (i = 0; i < fTransTableSize; i++) {
        for (j = 0; j < fElemMapSize; j++) {
            if (fTransTable[i][j] == XMLContentModel::gInvalidTrans)
                continue;
            for (k = j+1; k < fElemMapSize; k++) {
                if (fTransTable[i][k] != XMLContentModel::gInvalidTrans &&
                    conflictTable[j][k] == 0) {

                    // If this is text in a Schema mixed content model, skip it.
                    if ( fIsMixed &&
                         (( fElemMap[j]->getURI() == XMLElementDecl::fgPCDataElemId) ||
                          ( fElemMap[k]->getURI() == XMLElementDecl::fgPCDataElemId)))
                        continue;

                    if (XercesElementWildcard::conflict(pGrammar,
                                                        fElemMapType[j],
                                                        fElemMap[j],
                                                        fElemMapType[k],
                                                        fElemMap[k],
                                                        &comparator)) {
                        if (fCountingStates != 0) {
                            Occurence* o = fCountingStates[i];
                            // If "i" is a counting state and exactly one of the transitions
                            // loops back to "i" then the two particles do not overlap if
                            // minOccurs == maxOccurs.
                            if (o != 0 &&
                                ((fTransTable[i][j] == i) ^ (fTransTable[i][k] == i)) &&
                                o->minOccurs == o->maxOccurs) {
                                conflictTable[j][k] = -1;
                                continue;
                            }
                        }
                       conflictTable[j][k] = 1;

                       XMLBuffer buf1(1023, fMemoryManager);
                       if (((fElemMapType[j] & 0x0f) == ContentSpecNode::Any) ||
                           ((fElemMapType[j] & 0x0f) == ContentSpecNode::Any_NS))
                           buf1.set(SchemaSymbols::fgATTVAL_TWOPOUNDANY);
                       else if ((fElemMapType[j] & 0x0f) == ContentSpecNode::Any_Other)
                           buf1.set(SchemaSymbols::fgATTVAL_TWOPOUNDOTHER);
                       else
                           buf1.set(fElemMap[j]->getRawName());

                       XMLBuffer buf2(1023, fMemoryManager);
                       if (((fElemMapType[k] & 0x0f) == ContentSpecNode::Any) ||
                           ((fElemMapType[k] & 0x0f) == ContentSpecNode::Any_NS))
                           buf2.set(SchemaSymbols::fgATTVAL_TWOPOUNDANY);
                       else if ((fElemMapType[k] & 0x0f) == ContentSpecNode::Any_Other)
                           buf2.set(SchemaSymbols::fgATTVAL_TWOPOUNDOTHER);
                       else
                           buf2.set(fElemMap[k]->getRawName());

                       pValidator->emitError(XMLValid::UniqueParticleAttributionFail,
                                             pComplexTypeName,
                                             buf1.getRawBuffer(),
                                             buf2.getRawBuffer());
                    }
                    else
                        conflictTable[j][k] = -1;
                }
            }
        }
    }
}